

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

void __thiscall QPainter::save(QPainter *this)

{
  QPaintEngineEx *pQVar1;
  bool bVar2;
  QPainterPrivate *pQVar3;
  pointer pQVar4;
  pointer pQVar5;
  long in_FS_OFFSET;
  QPainterPrivate *d;
  unique_ptr<QPainterState,_std::default_delete<QPainterState>_> next;
  unique_ptr<QPainterState,_std::default_delete<QPainterState>_> prev;
  pointer in_stack_ffffffffffffff68;
  QPainterPrivate *in_stack_ffffffffffffff70;
  unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *in_stack_ffffffffffffff78;
  QMessageLogger *in_stack_ffffffffffffff80;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QPainter *)0x58d97b);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x58d991);
  if (bVar2) {
    std::unique_ptr<QPainterState,std::default_delete<QPainterState>>::
    unique_ptr<std::default_delete<QPainterState>,void>
              ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
               in_stack_ffffffffffffff70);
    if (pQVar3->extended == (QPaintEngineEx *)0x0) {
      QPainterPrivate::updateState
                (in_stack_ffffffffffffff70,
                 (unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                 in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff70 = (QPainterPrivate *)&pQVar3->state;
      std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::get
                ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x58dad1);
      std::make_unique<QPainterState,QPainterState*>((QPainterState **)in_stack_ffffffffffffff78);
      std::
      exchange<std::unique_ptr<QPainterState,std::default_delete<QPainterState>>,std::unique_ptr<QPainterState,std::default_delete<QPainterState>>>
                (in_stack_ffffffffffffff78,
                 (unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                 in_stack_ffffffffffffff70);
      std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator=
                ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                 in_stack_ffffffffffffff70,
                 (unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                 in_stack_ffffffffffffff68);
      std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::~unique_ptr
                ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                 in_stack_ffffffffffffff70);
      std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::~unique_ptr
                ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                 in_stack_ffffffffffffff70);
      pQVar4 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::get
                         ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x58db2a
                         );
      in_stack_ffffffffffffff68 = (pointer)0x0;
      if (pQVar4 != (pointer)0x0) {
        in_stack_ffffffffffffff68 = (pointer)&pQVar4->super_QPaintEngineState;
      }
      pQVar5 = std::unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>::operator->
                         ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)
                          0x58db67);
      pQVar5->state = (QPaintEngineState *)in_stack_ffffffffffffff68;
    }
    else {
      pQVar1 = pQVar3->extended;
      pQVar4 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::get
                         ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x58da14
                         );
      (*(pQVar1->super_QPaintEngine)._vptr_QPaintEngine[0x18])(pQVar1,pQVar4);
      std::unique_ptr<QPainterState,std::default_delete<QPainterState>>::
      unique_ptr<std::default_delete<QPainterState>,void>
                ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                 in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      std::
      exchange<std::unique_ptr<QPainterState,std::default_delete<QPainterState>>,std::unique_ptr<QPainterState,std::default_delete<QPainterState>>>
                (in_stack_ffffffffffffff78,
                 (unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                 in_stack_ffffffffffffff70);
      std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator=
                ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                 in_stack_ffffffffffffff70,
                 (unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                 in_stack_ffffffffffffff68);
      std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::~unique_ptr
                ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                 in_stack_ffffffffffffff70);
      pQVar1 = pQVar3->extended;
      pQVar4 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::get
                         ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x58da82
                         );
      (*(pQVar1->super_QPaintEngine)._vptr_QPaintEngine[0x2f])(pQVar1,pQVar4);
      std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::~unique_ptr
                ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                 in_stack_ffffffffffffff70);
    }
    std::
    stack<std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>,_QVarLengthArray<std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>,_8LL>_>
    ::push((stack<std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>,_QVarLengthArray<std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>,_8LL>_>
            *)in_stack_ffffffffffffff70,(value_type *)in_stack_ffffffffffffff68);
    std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::~unique_ptr
              ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
               in_stack_ffffffffffffff70);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(char *)in_stack_ffffffffffffff68);
    QMessageLogger::warning(local_28,"QPainter::save: Painter not active");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::save()
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::save()\n");
#endif
    Q_D(QPainter);
    if (!d->engine) {
        qWarning("QPainter::save: Painter not active");
        return;
    }

    std::unique_ptr<QPainterState> prev;
    if (d->extended) {
        // separate the creation of a new state from the update of d->state, since some
        // engines access d->state directly (not via createState()'s argument)
        std::unique_ptr<QPainterState> next(d->extended->createState(d->state.get()));
        prev = std::exchange(d->state, std::move(next));
        d->extended->setState(d->state.get());
    } else {
        d->updateState(d->state);
        prev = std::exchange(d->state, std::make_unique<QPainterState>(d->state.get()));
        d->engine->state = d->state.get();
    }
    d->savedStates.push(std::move(prev));
}